

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::RemoveNode(GraphCycles *this,void *ptr)

{
  uint uVar1;
  Rep *pRVar2;
  Node **ppNVar3;
  NodeSet *pNVar4;
  uint32_t uVar5;
  Node *pNVar6;
  Node *pNVar7;
  uint uVar8;
  int32_t *piVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  int32_t i;
  int local_4c;
  GraphCycles *local_48;
  Node **local_40;
  NodeSet *local_38;
  
  pRVar2 = this->rep_;
  uVar8 = (int)ptr + (int)((ulong)ptr / 0x3fffb) * -0x3fffb;
  uVar13 = (ulong)(uint)(pRVar2->ptrmap_).table_._M_elems[uVar8];
  if (uVar13 == 0xffffffff) {
    return;
  }
  ppNVar3 = ((pRVar2->ptrmap_).nodes_)->ptr_;
  pNVar7 = ppNVar3[uVar13];
  if ((pNVar7->masked_ptr ^ (ulong)ptr) == 0xf03a5f7bf03a5f7b) {
    piVar9 = (pRVar2->ptrmap_).table_._M_elems + uVar8;
  }
  else {
    do {
      pNVar6 = pNVar7;
      uVar13 = (ulong)(uint)pNVar6->next_hash;
      if (uVar13 == 0xffffffff) {
        return;
      }
      pNVar7 = ppNVar3[uVar13];
    } while ((pNVar7->masked_ptr ^ (ulong)ptr) != 0xf03a5f7bf03a5f7b);
    piVar9 = &pNVar6->next_hash;
  }
  *piVar9 = pNVar7->next_hash;
  pNVar7->next_hash = -1;
  iVar12 = (int)uVar13;
  local_40 = (pRVar2->nodes_).ptr_;
  pNVar7 = local_40[uVar13];
  local_38 = &pNVar7->out;
  uVar8 = 0;
  local_4c = iVar12;
  local_48 = this;
  do {
    uVar1 = (pNVar7->out).table_.size_;
    if (uVar1 < uVar8) {
      uVar1 = uVar8;
    }
    lVar11 = 0;
    do {
      if ((ulong)uVar1 - (ulong)uVar8 == lVar11) {
        uVar8 = 0;
        do {
          uVar1 = (pNVar7->in).table_.size_;
          if (uVar1 < uVar8) {
            uVar1 = uVar8;
          }
          lVar11 = 0;
          do {
            if ((ulong)uVar1 - (ulong)uVar8 == lVar11) {
              anon_unknown_0::NodeSet::Init(&pNVar7->in);
              anon_unknown_0::NodeSet::Init(local_38);
              pNVar7->masked_ptr = 0xf03a5f7bf03a5f7b;
              if (pNVar7->version == 0xffffffff) {
                return;
              }
              pNVar7->version = pNVar7->version + 1;
              anon_unknown_0::Vec<int>::push_back(&local_48->rep_->free_nodes_,&local_4c);
              return;
            }
            lVar10 = (long)(pNVar7->in).table_.ptr_[(ulong)uVar8 + lVar11];
            lVar11 = lVar11 + 1;
          } while (lVar10 < 0);
          pNVar4 = (NodeSet *)(local_40[lVar10]->out).table_.ptr_;
          uVar5 = anon_unknown_0::NodeSet::FindIndex(pNVar4,(local_40[lVar10]->out).table_.size_);
          if ((pNVar4->table_).space_[(ulong)uVar5 - 2] == iVar12) {
            (pNVar4->table_).space_[(ulong)uVar5 - 2] = -2;
          }
          uVar8 = uVar8 + (int)lVar11;
        } while( true );
      }
      lVar10 = (long)(pNVar7->out).table_.ptr_[(ulong)uVar8 + lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar10 < 0);
    pNVar4 = (NodeSet *)(local_40[lVar10]->in).table_.ptr_;
    uVar5 = anon_unknown_0::NodeSet::FindIndex(pNVar4,(local_40[lVar10]->in).table_.size_);
    if ((pNVar4->table_).space_[(ulong)uVar5 - 2] == iVar12) {
      (pNVar4->table_).space_[(ulong)uVar5 - 2] = -2;
    }
    uVar8 = uVar8 + (int)lVar11;
  } while( true );
}

Assistant:

void GraphCycles::RemoveNode(void* ptr) {
  int32_t i = rep_->ptrmap_.Remove(ptr);
  if (i == -1) {
    return;
  }
  Node* x = rep_->nodes_[static_cast<uint32_t>(i)];
  HASH_FOR_EACH(y, x->out) {
    rep_->nodes_[static_cast<uint32_t>(y)]->in.erase(i);
  }
  HASH_FOR_EACH(y, x->in) {
    rep_->nodes_[static_cast<uint32_t>(y)]->out.erase(i);
  }
  x->in.clear();
  x->out.clear();
  x->masked_ptr = base_internal::HidePtr<void>(nullptr);
  if (x->version == std::numeric_limits<uint32_t>::max()) {
    // Cannot use x any more
  } else {
    x->version++;  // Invalidates all copies of node.
    rep_->free_nodes_.push_back(i);
  }
}